

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

OrphanBuilder * __thiscall
capnp::_::OrphanBuilder::referenceExternalData
          (OrphanBuilder *__return_storage_ptr__,OrphanBuilder *this,BuilderArena *arena,Reader data
          )

{
  ArrayPtr<const_capnp::word> content;
  bool bVar1;
  uint uVar2;
  uchar *puVar3;
  size_t i;
  unsigned_long uVar4;
  word *pwVar5;
  WirePointer *pWVar6;
  SegmentBuilder *pSVar7;
  undefined1 auStack_a0 [8];
  ArrayPtr<const_capnp::word> words;
  WordCount wordCount;
  unsigned_long checkedSize;
  Fault local_70;
  Fault f;
  ulong local_60;
  DebugExpression<unsigned_long> local_58;
  undefined1 local_50 [8];
  DebugComparison<unsigned_long,_int> _kjCondition;
  BuilderArena *arena_local;
  Reader data_local;
  OrphanBuilder *result;
  
  data_local.super_ArrayPtr<const_unsigned_char>.ptr = data.super_ArrayPtr<const_unsigned_char>.ptr;
  _kjCondition._32_8_ = this;
  arena_local = arena;
  data_local.super_ArrayPtr<const_unsigned_char>.size_ = (size_t)__return_storage_ptr__;
  puVar3 = kj::ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)&arena_local);
  local_60 = (ulong)puVar3 & 7;
  local_58 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_60);
  f.exception._4_4_ = 0;
  kj::_::DebugExpression<unsigned_long>::operator==
            ((DebugComparison<unsigned_long,_int> *)local_50,&local_58,
             (int *)((long)&f.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_50);
  if (bVar1) {
    i = kj::ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&arena_local);
    uVar4 = bounded<unsigned_long>(i);
    uVar4 = assertMaxBits<29u,unsigned_long,kj::ThrowOverflow>
                      (uVar4,(ThrowOverflow *)((long)&words.size_ + 7));
    wordCount = (WordCount)uVar4;
    words.size_._0_4_ = WireHelpers::roundBytesUpToWords(wordCount);
    pwVar5 = (word *)kj::ArrayPtr<const_unsigned_char>::begin
                               ((ArrayPtr<const_unsigned_char> *)&arena_local);
    uVar2 = unbound<unsigned_int>((WordCount)words.size_);
    kj::ArrayPtr<const_capnp::word>::ArrayPtr
              ((ArrayPtr<const_capnp::word> *)auStack_a0,pwVar5,(ulong)uVar2);
    OrphanBuilder(__return_storage_ptr__);
    pWVar6 = tagAsPtr(__return_storage_ptr__);
    WirePointer::setKindForOrphan(pWVar6,LIST);
    pWVar6 = tagAsPtr(__return_storage_ptr__);
    WirePointer::ListRef::set(&(pWVar6->field_1).listRef,BYTE,wordCount);
    content.size_ = (size_t)words.ptr;
    content.ptr = (word *)auStack_a0;
    pSVar7 = BuilderArena::addExternalSegment((BuilderArena *)_kjCondition._32_8_,content);
    __return_storage_ptr__->segment = pSVar7;
    __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
    pwVar5 = kj::ArrayPtr<const_capnp::word>::begin((ArrayPtr<const_capnp::word> *)auStack_a0);
    __return_storage_ptr__->location = pwVar5;
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[52]>
            (&local_70,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
             ,0xde4,FAILED,"reinterpret_cast<uintptr_t>(data.begin()) % sizeof(void*) == 0",
             "_kjCondition,\"Cannot referenceExternalData() that is not aligned.\"",
             (DebugComparison<unsigned_long,_int> *)local_50,
             (char (*) [52])"Cannot referenceExternalData() that is not aligned.");
  kj::_::Debug::Fault::fatal(&local_70);
}

Assistant:

OrphanBuilder OrphanBuilder::referenceExternalData(BuilderArena* arena, Data::Reader data) {
  KJ_REQUIRE(reinterpret_cast<uintptr_t>(data.begin()) % sizeof(void*) == 0,
             "Cannot referenceExternalData() that is not aligned.");

  auto checkedSize = assertMaxBits<BLOB_SIZE_BITS>(bounded(data.size()));
  auto wordCount = WireHelpers::roundBytesUpToWords(checkedSize * BYTES);
  kj::ArrayPtr<const word> words(reinterpret_cast<const word*>(data.begin()),
                                 unbound(wordCount / WORDS));

  OrphanBuilder result;
  result.tagAsPtr()->setKindForOrphan(WirePointer::LIST);
  result.tagAsPtr()->listRef.set(ElementSize::BYTE, checkedSize * ELEMENTS);
  result.segment = arena->addExternalSegment(words);

  // External data cannot possibly contain capabilities.
  result.capTable = nullptr;

  // const_cast OK here because we will check whether the segment is writable when we try to get
  // a builder.
  result.location = const_cast<word*>(words.begin());

  return result;
}